

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O1

void __thiscall Js::Profiler::MergeTree(Profiler *this,TypeNode *toNode,TypeNode *fromNode)

{
  TimeStamp *pTVar1;
  TypeNode *fromNode_00;
  TreeNode<Js::UnitData,_373> *toNode_00;
  TypeNode *fromChild;
  long lVar2;
  
  (toNode->value).count = (toNode->value).count + (fromNode->value).count;
  pTVar1 = &(toNode->value).incl;
  *pTVar1 = *pTVar1 + (fromNode->value).incl;
  pTVar1 = &(toNode->value).excl;
  *pTVar1 = *pTVar1 + (fromNode->value).excl;
  lVar2 = (fromNode->value).max;
  if ((toNode->value).max < lVar2) {
    (toNode->value).max = lVar2;
  }
  lVar2 = 4;
  do {
    fromNode_00 = fromNode->children[lVar2 + -4];
    if (fromNode_00 != (TypeNode *)0x0) {
      toNode_00 = toNode->children[lVar2 + -4];
      if (toNode_00 == (TreeNode<Js::UnitData,_373> *)0x0) {
        toNode_00 = (TreeNode<Js::UnitData,_373> *)
                    new<Memory::ArenaAllocator>(0xbd0,this->alloc,0x366bee);
        UnitData::UnitData((UnitData *)toNode_00);
        toNode_00->parent = toNode;
        memset(toNode_00->children,0,0xba8);
        toNode->children[lVar2 + -4] = toNode_00;
      }
      MergeTree(this,toNode_00,fromNode_00);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x179);
  return;
}

Assistant:

void
    Profiler::MergeTree(TypeNode * toNode, TypeNode * fromNode)
    {
        UnitData * toData = toNode->GetValue();
        const UnitData * fromData = fromNode->GetValue();

        toData->count += fromData->count;
        toData->incl += fromData->incl;
        toData->excl += fromData->excl;
        if (fromData->max > toData->max)
        {
            toData->max = fromData->max;
        }
        for (int i = 0; i < PhaseCount; i++)
        {
            if (fromNode->ChildExistsAt(i))
            {
                TypeNode * fromChild = fromNode->GetChildAt(i);
                TypeNode * toChild;
                if (!toNode->ChildExistsAt(i))
                {
                    toChild = Anew(this->alloc, TypeNode, toNode);
                    toNode->SetChildAt(i, toChild);
                }
                else
                {
                    toChild = toNode->GetChildAt(i);
                }
                MergeTree(toChild, fromChild);
            }
        }
    }